

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O1

float wlapu(qnode_ptr_t p,int x,int y,float a,float c)

{
  int iVar1;
  disp_field512_t *padVar2;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Db;
  
  padVar2 = p->flow_ptr;
  iVar1 = p->res;
  return ((*padVar2)[iVar1 * x + y + -1].x + (*padVar2)[iVar1 * x + 1 + y].x) *
         (float)(double)CONCAT44(in_XMM1_Db,c) +
         ((*padVar2)[(x + -1) * iVar1 + y].x + (*padVar2)[(x + 1) * iVar1 + y].x) *
         (float)(double)CONCAT44(in_XMM0_Db,a);
}

Assistant:

float wlapu(p,x,y,a,c)
qnode_ptr_t p ;
int x, y ;
float a, c ;

{ float d ;

  d = a*((*p->flow_ptr)[p->res*(x-1) + y].x +
  (*p->flow_ptr)[p->res*(x+1) + y].x) +
  c*((*p->flow_ptr)[p->res*x + (y-1)].x +
  (*p->flow_ptr)[p->res*x + (y+1)].x) ;
   return(d) ;
}